

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# loop_descriptor.cpp
# Opt level: O0

bool spvtools::opt::anon_unknown_28::IsBasicBlockSafeToClone(IRContext *context,BasicBlock *bb)

{
  bool bVar1;
  Instruction *this;
  Instruction *inst;
  iterator __end2;
  iterator __begin2;
  BasicBlock *__range2;
  BasicBlock *bb_local;
  IRContext *context_local;
  
  BasicBlock::begin((BasicBlock *)&__end2);
  BasicBlock::end((BasicBlock *)&inst);
  while( true ) {
    bVar1 = utils::operator!=(&__end2.super_iterator,
                              (iterator_template<spvtools::opt::Instruction> *)&inst);
    if (!bVar1) {
      return true;
    }
    this = utils::IntrusiveList<spvtools::opt::Instruction>::
           iterator_template<spvtools::opt::Instruction>::operator*(&__end2.super_iterator);
    bVar1 = Instruction::IsBranch(this);
    if ((!bVar1) && (bVar1 = IRContext::IsCombinatorInstruction(context,this), !bVar1)) break;
    InstructionList::iterator::operator++(&__end2);
  }
  return false;
}

Assistant:

inline bool IsBasicBlockSafeToClone(IRContext* context, BasicBlock* bb) {
  for (Instruction& inst : *bb) {
    if (!inst.IsBranch() && !context->IsCombinatorInstruction(&inst))
      return false;
  }

  return true;
}